

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result_conflict *
CoreML::validatePositive(Result_conflict *__return_storage_ptr__,int value,string *name)

{
  undefined1 local_a0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string err;
  int value_local;
  Result_conflict *r;
  
  err.super__Rb_tree_node_base._M_right = &name->super__Rb_tree_node_base;
  err._M_storage._M_storage._4_4_ = value;
  if (value < 1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_a0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name,
                   " must be positive, got ");
    std::__cxx11::to_string((string *)local_a0,err._M_storage._M_storage._4_4_);
    std::operator+(&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_a0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,".");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)(local_a0 + 0x20));
    Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    Result::Result((Result *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validatePositive(const int value, const std::string& name) {
    if (value <= 0 ) {
        std::string err = name + " must be positive, got " + std::to_string(value) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    Result r;
    return r;
}